

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void cos1D_train<IMLE>(IMLE *imleObj,int nTrain)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  result_type_conflict rVar4;
  double dVar5;
  uniform_01<double,_double> uniform;
  Vec z;
  Vec x;
  int local_a0c;
  normal_distribution<double> local_a08;
  mt19937 rng;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&rng);
  local_a08._mean = 0.0;
  local_a08._sigma = 1.0;
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z,(int *)&x);
  local_a0c = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&x,&local_a0c);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Training, y = cos(x), ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nTrain);
  poVar1 = std::operator<<(poVar1," training points ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0;
  iVar2 = 0;
  if (0 < nTrain) {
    iVar2 = nTrain;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar4 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)&uniform,&rng);
    dVar5 = rVar4 * 0.02 +
            *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = dVar5;
    dVar5 = cos(dVar5);
    rVar4 = boost::random::normal_distribution<double>::operator()(&local_a08,&rng);
    *(double *)
     CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
              _4_4_,(int)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data) = rVar4 * 0.1 + dVar5;
    IMLE::update(imleObj,&z,&x);
    *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double)(~-(ulong)(12.566370614359172 <
                           *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data) &
                 (ulong)(*z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data + 0.1));
  }
  free((void *)CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._4_4_,
                        (int)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data));
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void cos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
    cout << "\t --- Training, y = cos(x), " << nTrain << " training points ---" << endl;
    z[0] = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        z[0] += uniform(rng) * NOISE_Z;
        x[0] = cos(z[0]) + NOISE_X * normal(rng);

        imleObj.update(z,x);

        if( z[0] > 4*M_PI )
            z[0] = 0.0;
        else
            z[0] += 0.1;
    }
}